

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpBase::BeginModule
          (BinaryReaderObjdumpBase *this,uint32_t version)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  undefined8 uVar2;
  char *extraout_RDX;
  string_view filename;
  allocator<char> local_91;
  string local_90 [32];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_60;
  size_t local_50;
  char *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined1 local_30 [8];
  string_view basename;
  uint32_t version_local;
  BinaryReaderObjdumpBase *this_local;
  
  basename._M_str._4_4_ = version;
  switch(this->options_->mode) {
  case Prepass:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,this->options_->filename);
    filename._M_str = extraout_RDX;
    filename._M_len = (size_t)local_40._M_str;
    _local_30 = GetBasename((wabt *)local_40._M_len,filename);
    local_50 = (size_t)local_30;
    local_48 = (char *)basename._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"-");
    __x._M_str = local_48;
    __x._M_len = local_50;
    bVar1 = std::operator==(__x,local_60);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"<stdin>");
      basename._M_len = (size_t)local_70._M_str;
      local_30 = (undefined1  [8])local_70._M_len;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_90,(basic_string_view<char,_std::char_traits<char>_> *)local_30,&local_91);
    uVar2 = std::__cxx11::string::c_str();
    printf("%s:\tfile format wasm %#x\n",uVar2,(ulong)basename._M_str._4_4_);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    break;
  case Headers:
    printf("\n");
    printf("Sections:\n\n");
    break;
  case Details:
    printf("\n");
    printf("Section Details:\n\n");
    break;
  case Disassemble:
    printf("\n");
    printf("Code Disassembly:\n\n");
    break;
  case RawData:
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpBase::BeginModule(uint32_t version) {
  switch (options_->mode) {
    case ObjdumpMode::Headers:
      printf("\n");
      printf("Sections:\n\n");
      break;
    case ObjdumpMode::Details:
      printf("\n");
      printf("Section Details:\n\n");
      break;
    case ObjdumpMode::Disassemble:
      printf("\n");
      printf("Code Disassembly:\n\n");
      break;
    case ObjdumpMode::Prepass: {
      std::string_view basename = GetBasename(options_->filename);
      if (basename == "-") {
        basename = "<stdin>";
      }
      printf("%s:\tfile format wasm %#x\n", std::string(basename).c_str(),
             version);
      break;
    }
    case ObjdumpMode::RawData:
      break;
  }

  return Result::Ok;
}